

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O3

void CBinds::ConBinds(IResult *pResult,void *pUserData)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  char *pcVar4;
  int m;
  long lVar5;
  int i;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  long in_FS_OFFSET;
  int Modifier;
  char aBuf [1024];
  int local_43c;
  char local_438 [1024];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pResult->m_NumArgs == 1) {
    iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
    pcVar8 = (char *)CONCAT44(extraout_var,iVar2);
    uVar3 = DecodeBindString((CBinds *)pResult,pcVar8,&local_43c);
    if (uVar3 == 0) {
      str_format(local_438,0x100,"key \'%s\' not found",pcVar8);
    }
    else if (*(char *)((long)pUserData + (long)local_43c * 0x80 + 0x28 + (long)(int)uVar3 * 0x200)
             == '\0') {
      str_format(local_438,0x100,"%s (%d) is not bound",pcVar8,(ulong)uVar3);
    }
    else {
      str_format(local_438,0x100,"%s (%d) = %s",pcVar8,(ulong)uVar3,
                 (long)pUserData + (long)local_43c * 0x80 + (long)(int)uVar3 * 0x200 + 0x28);
    }
    plVar1 = *(long **)(*(long *)((long)pUserData + 8) + 0x870);
    (**(code **)(*plVar1 + 200))(plVar1,0,"binds",local_438,0);
  }
  else if (pResult->m_NumArgs == 0) {
    pcVar8 = (char *)((long)pUserData + 0x28);
    uVar6 = 0;
    do {
      lVar5 = 0;
      pcVar7 = pcVar8;
      do {
        if (*pcVar7 != '\0') {
          pcVar4 = "";
          if ((uint)(lVar5 - 1U) < 3) {
            pcVar4 = (&PTR_anon_var_dwarf_3da52_00211a30)[lVar5 - 1U & 0xffffffff];
          }
          str_format(local_438,0x400,"%s%s (%d) = %s",pcVar4,g_aaKeyStrings + uVar6,
                     uVar6 & 0xffffffff,pcVar7);
          plVar1 = *(long **)(*(long *)((long)pUserData + 8) + 0x870);
          (**(code **)(*plVar1 + 200))(plVar1,0,"binds",local_438,0);
        }
        lVar5 = lVar5 + 1;
        pcVar7 = pcVar7 + 0x80;
      } while (lVar5 != 4);
      uVar6 = uVar6 + 1;
      pcVar8 = pcVar8 + 0x200;
    } while (uVar6 != 0x1da);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CBinds::ConBinds(IConsole::IResult *pResult, void *pUserData)
{
	CBinds *pBinds = (CBinds *)pUserData;
	char aBuf[1024];
	if(pResult->NumArguments() == 1)
	{
		char aBuf[256];
		const char *pKeyName = pResult->GetString(0);

		int Modifier;
		int KeyID = pBinds->DecodeBindString(pKeyName, &Modifier);
		if(!KeyID)
		{
			str_format(aBuf, sizeof(aBuf), "key '%s' not found", pKeyName);
			pBinds->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "binds", aBuf);
		}
		else
		{
			if(pBinds->m_aaaKeyBindings[KeyID][Modifier][0] == 0)
				str_format(aBuf, sizeof(aBuf), "%s (%d) is not bound", pKeyName, KeyID);
			else
				str_format(
					aBuf,
					sizeof(aBuf),
					"%s (%d) = %s",
					pKeyName, KeyID, pBinds->m_aaaKeyBindings[KeyID][Modifier]
				);
			pBinds->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "binds", aBuf);
		}
	}
	else if(pResult->NumArguments() == 0)
	{
		for(int i = 0; i < KEY_LAST; i++)
		{
			for(int m = 0; m < MODIFIER_COUNT; m++)
			{
				if(pBinds->m_aaaKeyBindings[i][m][0] == 0)
					continue;
				str_format(aBuf, sizeof(aBuf), "%s%s (%d) = %s", GetModifierName(m), pBinds->Input()->KeyName(i), i, pBinds->m_aaaKeyBindings[i][m]);
				pBinds->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "binds", aBuf);
			}
		}
	}
}